

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

char * Json_ReadPreprocess(char *pIn,int nFileSize)

{
  char *pcVar1;
  int local_28;
  int local_24;
  int k;
  int i;
  char *pOut;
  int nFileSize_local;
  char *pIn_local;
  
  pcVar1 = (char *)malloc((long)(nFileSize * 3));
  local_28 = 0;
  for (local_24 = 0; local_24 < nFileSize; local_24 = local_24 + 1) {
    if ((((pIn[local_24] == '{') || (pIn[local_24] == '}')) || (pIn[local_24] == '[')) ||
       (pIn[local_24] == ']')) {
      pcVar1[local_28] = ' ';
      pcVar1[local_28 + 1] = pIn[local_24];
      pcVar1[local_28 + 2] = ' ';
      local_28 = local_28 + 3;
    }
    else {
      pcVar1[local_28] = pIn[local_24];
      local_28 = local_28 + 1;
    }
  }
  pcVar1[local_28] = '\0';
  return pcVar1;
}

Assistant:

char * Json_ReadPreprocess( char * pIn, int nFileSize )
{
    char * pOut = ABC_ALLOC( char, 3*nFileSize ); int i, k = 0;
    for ( i = 0; i < nFileSize; i++ )
        if ( pIn[i] == '{' || pIn[i] == '}' || pIn[i] == '[' || pIn[i] == ']' )
        {
            pOut[k++] = ' ';
            pOut[k++] = pIn[i];
            pOut[k++] = ' ';
        }
        else
            pOut[k++] = pIn[i];
    pOut[k++] = '\0';
    return pOut;
}